

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O3

void __thiscall
GetOpt::OptionsFileNotFoundEx::OptionsFileNotFoundEx(OptionsFileNotFoundEx *this,string *file)

{
  pointer pcVar1;
  
  this->super_GetOptEx = (GetOptEx)&PTR__OptionsFileNotFoundEx_00127af8;
  (this->targetFile)._M_dataplus._M_p = (pointer)&(this->targetFile).field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->targetFile,pcVar1,pcVar1 + file->_M_string_length);
  return;
}

Assistant:

OptionsFileNotFoundEx(const std::string& file) : targetFile(file) {}